

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O2

void FOOLElimination::reportProcessed(string *inputRepr,string *outputRepr)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R14;
  
  bVar1 = std::operator!=(unaff_R14,unaff_RBX);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[PP] FOOL in:  ");
    poVar2 = std::operator<<(poVar2,(string *)inputRepr);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"[PP] FOOL out: ");
    poVar2 = std::operator<<(poVar2,(string *)outputRepr);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

void FOOLElimination::reportProcessed(std::string inputRepr, std::string outputRepr) {
  if (inputRepr != outputRepr) {
    /**
     * If show_fool is set to off, the string representations of the input
     * and the output of process() may in some cases coincide, despite the
     * input and the output being different. Example: $term{$true} and
     * $true. In order to avoid misleading log messages with the input and
     * the output seeming the same, we will not log such processings at
     * all. Setting show_fool to on, however, will display everything.
     */
    std::cout << "[PP] FOOL in:  " << inputRepr  << endl;
    std::cout << "[PP] FOOL out: " << outputRepr << endl;
  }
}